

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O1

int __thiscall
CVmObjIterIdx::getp_reset_iter(CVmObjIterIdx *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  
  if (getp_reset_iter(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_reset_iter();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_reset_iter::desc);
  if (iVar1 == 0) {
    set_cur_index(this,self,(ulong)*(uint *)((this->super_CVmObjIter).super_CVmObject.ext_ + 9) - 1)
    ;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjIterIdx::getp_reset_iter(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                   uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set the index to the first valid index minus one */
    set_cur_index(vmg_ self, get_first_valid() - 1);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}